

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::internal::InitShutdownFunctions(void)

{
  vector<void_(*)(),_std::allocator<void_(*)()>_> *this;
  Mutex *this_00;
  
  this = (vector<void_(*)(),_std::allocator<void_(*)()>_> *)operator_new(0x18);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::vector(this);
  shutdown_functions = this;
  this_00 = (Mutex *)operator_new(8);
  Mutex::Mutex(this_00);
  shutdown_functions_mutex = this_00;
  return;
}

Assistant:

void InitShutdownFunctions() {
  shutdown_functions = new vector<void (*)()>;
  shutdown_functions_mutex = new Mutex;
}